

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxReduce_MinMaxLoc_Test::~MxxReduce_MinMaxLoc_Test(MxxReduce_MinMaxLoc_Test *this)

{
  MxxReduce_MinMaxLoc_Test *this_local;
  
  ~MxxReduce_MinMaxLoc_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxReduce, MinMaxLoc) {
    mxx::comm c;

    std::pair<double, int> maxloc = mxx::max_element(3.1*c.rank(), c);
    ASSERT_EQ(c.size()-1, maxloc.second);
    ASSERT_EQ(3.1*(c.size()-1), maxloc.first);

    std::pair<int, int> minloc = mxx::min_element(c.rank()+13);
    ASSERT_EQ(13, minloc.first);
    ASSERT_EQ(0, minloc.second);
}